

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O3

void __thiscall
xray_re::cse_alife_item::state_read(cse_alife_item *this,xr_packet *packet,uint16_t size)

{
  uint64_t uVar1;
  uint64_t uVar2;
  char value_2;
  short value;
  short value_1;
  undefined1 local_1d;
  undefined1 local_1c [2];
  undefined1 local_1a [2];
  
  cse_alife_dynamic_object_visual::state_read(&this->super_cse_alife_dynamic_object_visual,packet,0)
  ;
  uVar1 = (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
          super_cse_alife_object.super_cse_abstract.m_clsid.field_0.quad;
  uVar2 = xr_clsid::to_quad("W_BINOC");
  if ((uVar1 == uVar2) &&
     ((this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
      super_cse_alife_object.super_cse_abstract.m_version < 0x25)) {
    xr_packet::r_raw(packet,local_1c,2);
    xr_packet::r_raw(packet,local_1a,2);
    xr_packet::r_raw(packet,&local_1d,1);
  }
  cse_alife_inventory_item::state_read(&this->super_cse_alife_inventory_item,packet,0);
  return;
}

Assistant:

void cse_alife_item::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_dynamic_object_visual::state_read(packet, size);
	if (m_clsid == "W_BINOC" && m_version < CSE_VERSION_0x25) {
		packet.r_s16();
		packet.r_s16();
		packet.r_s8();
	}
	cse_alife_inventory_item::state_read(packet, size);
}